

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void train_one(problem *prob,parameter *param,double *w,double Cp,double Cn)

{
  double eps_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  l2r_lr_fun *this;
  l2r_l2_svc_fun *this_00;
  ulong uVar5;
  double *pdVar6;
  l2r_l2_svr_fun *this_01;
  double eps_01;
  undefined1 local_168 [8];
  TRON tron_obj_2;
  int i_3;
  double *C_2;
  feature_node *x_space_1;
  problem prob_col_1;
  feature_node *x_space;
  problem prob_col;
  TRON tron_obj_1;
  int i_2;
  double *C_1;
  TRON tron_obj;
  int local_6c;
  int i_1;
  double *C;
  function *fun_obj;
  double primal_solver_tol;
  int i;
  int neg;
  int pos;
  double eps_cg;
  double eps;
  double Cn_local;
  double Cp_local;
  double *w_local;
  parameter *param_local;
  problem *prob_local;
  
  eps_00 = param->eps;
  _neg = 0.1;
  if (param->init_sol != (double *)0x0) {
    _neg = 0.5;
  }
  i = 0;
  for (primal_solver_tol._4_4_ = 0; primal_solver_tol._4_4_ < prob->l;
      primal_solver_tol._4_4_ = primal_solver_tol._4_4_ + 1) {
    if (0.0 < prob->y[primal_solver_tol._4_4_]) {
      i = i + 1;
    }
  }
  iVar4 = min<int>(i,prob->l - i);
  iVar4 = max<int>(iVar4,1);
  eps_01 = (eps_00 * (double)iVar4) / (double)prob->l;
  switch(param->solver_type) {
  case 0:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)prob->l;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar6 = (double *)operator_new__(uVar5);
    for (local_6c = 0; local_6c < prob->l; local_6c = local_6c + 1) {
      if (prob->y[local_6c] <= 0.0) {
        pdVar6[local_6c] = Cn;
      }
      else {
        pdVar6[local_6c] = Cp;
      }
    }
    this = (l2r_lr_fun *)operator_new(0x30);
    l2r_lr_fun::l2r_lr_fun(this,prob,pdVar6);
    TRON::TRON((TRON *)&C_1,(function *)this,eps_01,_neg,1000);
    TRON::set_print_string((TRON *)&C_1,liblinear_print_string);
    TRON::tron((TRON *)&C_1,w);
    if (this != (l2r_lr_fun *)0x0) {
      (*(this->super_function)._vptr_function[5])();
    }
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
    TRON::~TRON((TRON *)&C_1);
    break;
  case 1:
    solve_l2r_l1l2_svc(prob,w,eps_00,Cp,Cn,1);
    break;
  case 2:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)prob->l;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar6 = (double *)operator_new__(uVar5);
    for (tron_obj_1.tron_print_string._4_4_ = 0; tron_obj_1.tron_print_string._4_4_ < prob->l;
        tron_obj_1.tron_print_string._4_4_ = tron_obj_1.tron_print_string._4_4_ + 1) {
      if (prob->y[tron_obj_1.tron_print_string._4_4_] <= 0.0) {
        pdVar6[tron_obj_1.tron_print_string._4_4_] = Cn;
      }
      else {
        pdVar6[tron_obj_1.tron_print_string._4_4_] = Cp;
      }
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x40);
    l2r_l2_svc_fun::l2r_l2_svc_fun(this_00,prob,pdVar6);
    TRON::TRON((TRON *)&prob_col.bias,(function *)this_00,eps_01,_neg,1000);
    TRON::set_print_string((TRON *)&prob_col.bias,liblinear_print_string);
    TRON::tron((TRON *)&prob_col.bias,w);
    if (this_00 != (l2r_l2_svc_fun *)0x0) {
      (*(this_00->super_function)._vptr_function[5])();
    }
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
    TRON::~TRON((TRON *)&prob_col.bias);
    break;
  case 3:
    solve_l2r_l1l2_svc(prob,w,eps_00,Cp,Cn,3);
    break;
  default:
    fprintf(_stderr,"ERROR: unknown solver_type\n");
    break;
  case 5:
    prob_col_1.bias = 0.0;
    transpose(prob,(feature_node **)&prob_col_1.bias,(problem *)&x_space);
    solve_l1r_l2_svc((problem *)&x_space,w,eps_01,Cp,Cn);
    if (prob_col._0_8_ != 0) {
      operator_delete__((void *)prob_col._0_8_);
    }
    if (prob_col.y != (double *)0x0) {
      operator_delete__(prob_col.y);
    }
    if (prob_col_1.bias != 0.0) {
      operator_delete__((void *)prob_col_1.bias);
    }
    break;
  case 6:
    C_2 = (double *)0x0;
    transpose(prob,(feature_node **)&C_2,(problem *)&x_space_1);
    solve_l1r_lr((problem *)&x_space_1,w,eps_01,Cp,Cn);
    if (prob_col_1._0_8_ != 0) {
      operator_delete__((void *)prob_col_1._0_8_);
    }
    if (prob_col_1.y != (double *)0x0) {
      operator_delete__(prob_col_1.y);
    }
    if (C_2 != (double *)0x0) {
      operator_delete__(C_2);
    }
    break;
  case 7:
    solve_l2r_lr_dual(prob,w,eps_00,Cp,Cn);
    break;
  case 0xb:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)prob->l;
    uVar5 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar6 = (double *)operator_new__(uVar5);
    for (tron_obj_2.tron_print_string._4_4_ = 0; tron_obj_2.tron_print_string._4_4_ < prob->l;
        tron_obj_2.tron_print_string._4_4_ = tron_obj_2.tron_print_string._4_4_ + 1) {
      pdVar6[tron_obj_2.tron_print_string._4_4_] = param->C;
    }
    this_01 = (l2r_l2_svr_fun *)operator_new(0x48);
    l2r_l2_svr_fun::l2r_l2_svr_fun(this_01,prob,pdVar6,param->p);
    TRON::TRON((TRON *)local_168,(function *)this_01,param->eps,0.1,1000);
    TRON::set_print_string((TRON *)local_168,liblinear_print_string);
    TRON::tron((TRON *)local_168,w);
    if (this_01 != (l2r_l2_svr_fun *)0x0) {
      (*(this_01->super_l2r_l2_svc_fun).super_function._vptr_function[5])();
    }
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
    TRON::~TRON((TRON *)local_168);
    break;
  case 0xc:
    solve_l2r_l1l2_svr(prob,w,param,0xc);
    break;
  case 0xd:
    solve_l2r_l1l2_svr(prob,w,param,0xd);
  }
  return;
}

Assistant:

static void train_one(const problem *prob, const parameter *param, double *w, double Cp, double Cn)
{
	//inner and outer tolerances for TRON
	double eps = param->eps;
	double eps_cg = 0.1;
	if(param->init_sol != NULL)
		eps_cg = 0.5;

	int pos = 0;
	int neg = 0;
	for(int i=0;i<prob->l;i++)
		if(prob->y[i] > 0)
			pos++;
	neg = prob->l - pos;
	double primal_solver_tol = eps*max(min(pos,neg), 1)/prob->l;

	function *fun_obj=NULL;
	switch(param->solver_type)
	{
		case L2R_LR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_lr_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_l2_svc_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L2LOSS_SVC_DUAL);
			break;
		case L2R_L1LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L1LOSS_SVC_DUAL);
			break;
		case L1R_L2LOSS_SVC:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_l2_svc(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L1R_LR:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_lr(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L2R_LR_DUAL:
			solve_l2r_lr_dual(prob, w, eps, Cp, Cn);
			break;
		case L2R_L2LOSS_SVR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
				C[i] = param->C;

			fun_obj=new l2r_l2_svr_fun(prob, C, param->p);
			TRON tron_obj(fun_obj, param->eps);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;

		}
		case L2R_L1LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L1LOSS_SVR_DUAL);
			break;
		case L2R_L2LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L2LOSS_SVR_DUAL);
			break;
		default:
			fprintf(stderr, "ERROR: unknown solver_type\n");
			break;
	}
}